

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O1

void outputChar(char c,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = *outIx;
  if ((long)iVar2 == 0) {
LAB_002e18be:
    if (indent < 1) goto LAB_002e1901;
  }
  else {
    if (c == '\0') goto LAB_002e1901;
    if (c == '\n') {
      bVar1 = capacity <= iVar2;
    }
    else {
      if ((iVar2 < capacity) && (outBuf[(long)iVar2 + -1] == '\n')) goto LAB_002e18be;
      bVar1 = capacity <= iVar2 && c == '\n';
    }
    if (!(bool)(bVar1 & 0 < indent)) goto LAB_002e1901;
  }
  iVar2 = 1;
  if (1 < indent) {
    iVar2 = indent;
  }
  do {
    if (*outIx < capacity) {
      outBuf[*outIx] = ' ';
    }
    *outIx = *outIx + 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
LAB_002e1901:
  if (*outIx < capacity) {
    outBuf[*outIx] = c;
  }
  if (c != '\0') {
    *outIx = *outIx + 1;
  }
  return;
}

Assistant:

static void outputChar(char c, char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i;
    /* Check whether a start of line indenting is needed.  Three cases:
     *   1.  At the start of the first line  (output index == 0).
     *   2.  At the start of subsequent lines  (preceeding char in buffer == '\n')
     *   3.  When preflighting buffer len (buffer capacity is exceeded), when
     *       a \n is output.  Ideally we wouldn't do the indent until the following char
     *       is received, but that won't work because there's no place to remember that
     *       the preceding char was \n.  Meaning that we may overstimate the
     *       buffer size needed.  No harm done.
     */
    if (*outIx==0 ||   /* case 1. */
        (c!='\n' && c!=0 && *outIx < capacity && outBuf[(*outIx)-1]=='\n') ||  /* case 2. */
        (c=='\n' && *outIx>=capacity))    /* case 3 */
    {
        /* At the start of a line.  Indent. */
        for(i=0; i<indent; i++) {
            if (*outIx < capacity) {
                outBuf[*outIx] = ' ';
            }
            (*outIx)++;
        }
    }

    if (*outIx < capacity) {
        outBuf[*outIx] = c;
    }
    if (c != 0) {
        /* Nulls only appear as end-of-string terminators.  Move them to the output
         *  buffer, but do not update the length of the buffer, so that any
         *  following output will overwrite the null. */
        (*outIx)++;
    }
}